

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int check_type_properties(uint32_t property)

{
  uint uVar1;
  int local_c;
  uint32_t property_local;
  
  uVar1 = property & 0xf;
  if (((uVar1 - 1 < 2) || (uVar1 == 4)) || (uVar1 == 8)) {
    if (((property & 0x100) == 0) || ((property & 0x200) == 0)) {
      if (((property & 0x400) == 0) || ((property & 0x100) == 0)) {
        if (((property & 2) == 0) || ((property & 0x800) == 0)) {
          if (((property & 4) == 0) || ((property & 0x1000) != 0)) {
            if (((property & 2) == 0) || ((property & 0x1000) == 0)) {
              if (((property & 0x2000) == 0) || ((property & 0x4000) == 0)) {
                if (((property & 0x2000) == 0) || ((property & 0x800) != 0)) {
                  if (((property & 2) == 0) || ((property & 0x2000) == 0)) {
                    if (((property & 0x800) == 0) || ((property & 0x4000) == 0)) {
                      if (((property & 2) == 0) || ((property & 0x4000) != 0)) {
                        if (((property & 4) == 0) || ((property & 0x8000) != 0)) {
                          if (((property & 0x100) == 0) || ((property & 0x10000) != 0)) {
                            local_c = 0;
                          }
                          else {
                            local_c = -2;
                          }
                        }
                        else {
                          local_c = -2;
                        }
                      }
                      else {
                        local_c = -2;
                      }
                    }
                    else {
                      local_c = -2;
                    }
                  }
                  else {
                    local_c = -2;
                  }
                }
                else {
                  local_c = -2;
                }
              }
              else {
                local_c = -2;
              }
            }
            else {
              local_c = -2;
            }
          }
          else {
            local_c = -2;
          }
        }
        else {
          local_c = -2;
        }
      }
      else {
        local_c = -2;
      }
    }
    else {
      local_c = -2;
    }
  }
  else {
    local_c = -2;
  }
  return local_c;
}

Assistant:

int check_type_properties(uint32_t property)
{
    /* K, V, B, W all conflict with each other */
    switch (property & MINISCRIPT_TYPE_MASK) {
    case MINISCRIPT_TYPE_B:
    case MINISCRIPT_TYPE_V:
    case MINISCRIPT_TYPE_K:
    case MINISCRIPT_TYPE_W:
        break;
    default:
        return WALLY_EINVAL;
    }

    if ((property & MINISCRIPT_PROPERTY_Z) && (property & MINISCRIPT_PROPERTY_O))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_N) && (property & MINISCRIPT_PROPERTY_Z))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_D))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_K) && !(property & MINISCRIPT_PROPERTY_U))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_U))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_E) && (property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_E) && !(property & MINISCRIPT_PROPERTY_D))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_E))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_D) && (property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && !(property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_K) && !(property & MINISCRIPT_PROPERTY_S))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_Z) && !(property & MINISCRIPT_PROPERTY_M))
        return WALLY_EINVAL;

    return WALLY_OK;
}